

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_shapes.cxx
# Opt level: O1

void __thiscall xray_re::xr_shape_object::load(xr_shape_object *this,xr_reader *r)

{
  pointer *ppsVar1;
  uint *puVar2;
  iterator __position;
  pointer psVar3;
  uint8_t *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  size_t sVar12;
  ulong __n;
  uint16_t version;
  short local_7a;
  shape_def local_78;
  
  sVar12 = xr_reader::r_raw_chunk(r,0,&local_7a,2);
  if (sVar12 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_shapes.cxx"
                  ,0x1a,"virtual void xray_re::xr_shape_object::load(xr_reader &)");
  }
  if (local_7a == 1) {
    xr_custom_object::load(&this->super_xr_custom_object,r);
    sVar12 = xr_reader::find_chunk(r,1);
    if (sVar12 != 0) {
      puVar2 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
      __n = (ulong)*puVar2;
      std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>::reserve
                (&this->m_shapes,__n);
      if (__n != 0) {
        do {
          local_78.field_1._44_8_ = 0;
          local_78.field_1._52_8_ = 0;
          local_78.field_1._28_8_ = 0;
          local_78.field_1._36_8_ = 0;
          local_78.field_1._12_8_ = 0;
          local_78.field_1._20_8_ = 0;
          local_78._0_8_ = 0;
          local_78.field_1._4_8_ = 0;
          local_78.field_1._60_4_ = 0;
          __position._M_current =
               (this->m_shapes).
               super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->m_shapes).
              super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>::
            _M_realloc_insert<xray_re::shape_def>(&this->m_shapes,__position,&local_78);
          }
          else {
            *(undefined8 *)((long)&(__position._M_current)->field_1 + 0x2c) = 0;
            *(undefined8 *)((long)&(__position._M_current)->field_1 + 0x34) = 0;
            *(undefined8 *)((long)&(__position._M_current)->field_1 + 0x1c) = 0;
            *(undefined8 *)((long)&(__position._M_current)->field_1 + 0x24) = 0;
            *(undefined8 *)((long)&(__position._M_current)->field_1 + 0xc) = 0;
            *(undefined8 *)((long)&(__position._M_current)->field_1 + 0x14) = 0;
            *(undefined8 *)__position._M_current = 0;
            *(undefined8 *)((long)&(__position._M_current)->field_1 + 4) = 0;
            *(undefined4 *)((long)&(__position._M_current)->field_1 + 0x3c) = 0;
            ppsVar1 = &(this->m_shapes).
                       super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppsVar1 = *ppsVar1 + 1;
          }
          __n = __n - 1;
          psVar3 = (this->m_shapes).
                   super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          puVar4 = (r->field_2).m_p;
          (r->field_2).m_p = puVar4 + 1;
          psVar3[-1].type = *puVar4;
          puVar4 = (r->field_2).m_p;
          uVar5 = *(undefined8 *)puVar4;
          uVar6 = *(undefined8 *)(puVar4 + 8);
          uVar7 = *(undefined8 *)(puVar4 + 0x10);
          uVar8 = *(undefined8 *)(puVar4 + 0x18);
          uVar9 = *(undefined8 *)(puVar4 + 0x20);
          uVar10 = *(undefined8 *)(puVar4 + 0x28);
          uVar11 = *(undefined8 *)(puVar4 + 0x38);
          *(undefined8 *)((long)&psVar3[-1].field_1 + 0x30) = *(undefined8 *)(puVar4 + 0x30);
          *(undefined8 *)((long)&psVar3[-1].field_1 + 0x38) = uVar11;
          *(undefined8 *)((long)&psVar3[-1].field_1 + 0x20) = uVar9;
          *(undefined8 *)((long)&psVar3[-1].field_1 + 0x28) = uVar10;
          *(undefined8 *)((long)&psVar3[-1].field_1 + 0x10) = uVar7;
          *(undefined8 *)((long)&psVar3[-1].field_1 + 0x18) = uVar8;
          *(undefined8 *)&psVar3[-1].field_1 = uVar5;
          *(undefined8 *)((long)&psVar3[-1].field_1 + 8) = uVar6;
          (r->field_2).m_p = (r->field_2).m_p + 0x40;
        } while (__n != 0);
      }
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_shapes.cxx"
                  ,0x1e,"virtual void xray_re::xr_shape_object::load(xr_reader &)");
  }
  __assert_fail("version == SHAPE_VERSION",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_shapes.cxx"
                ,0x1b,"virtual void xray_re::xr_shape_object::load(xr_reader &)");
}

Assistant:

void xr_shape_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(SHAPE_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SHAPE_VERSION);
	xr_custom_object::load(r);
	if (!r.find_chunk(SHAPE_CHUNK_SHAPES))
		xr_not_expected();
	r.r_seq(r.r_u32(), m_shapes, read_shape());
	r.debug_find_chunk();
}